

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_sys_cfg.cpp
# Opt level: O3

MPP_RET mpp_sys_dec_buf_chk_proc(MppSysDecBufChkCfg *cfg)

{
  MppCodingType MVar1;
  MppFrameFormat MVar2;
  byte bVar3;
  MppFrameFormat MVar4;
  RockchipSocType RVar5;
  SysCfgAlignType SVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  RK_U32 RVar12;
  SysCfgAlignType type;
  ulong uVar13;
  RK_U32 RVar14;
  uint uVar15;
  bool bVar16;
  
  MVar1 = cfg->type;
  MVar2 = cfg->fmt_codec;
  MVar4 = MVar2 & 0xfffff;
  iVar8 = 10;
  if ((MVar4 | MPP_FMT_YUV422SP) != MPP_FMT_YUV422SP_10BIT) {
    iVar8 = (uint)(MVar4 == MPP_FMT_YUV444SP_10BIT) * 2 + 8;
  }
  if (MVar1 == MPP_VIDEO_CodingUnused) {
    _mpp_log_l(2,"mpp_sys_cfg","The coding type is invalid",(char *)0x0);
    return MPP_NOK;
  }
  uVar11 = cfg->fmt_fbc;
  RVar12 = cfg->v_stride;
  if ((((byte)mpp_sys_cfg_debug & 0x10) != 0) &&
     (_mpp_log_l(4,"mpp_sys_cfg","org pixel wxh: [%d %d]\n","mpp_sys_dec_buf_chk_proc",
                 (ulong)cfg->width,(ulong)cfg->height), ((byte)mpp_sys_cfg_debug & 0x10) != 0)) {
    _mpp_log_l(4,"mpp_sys_cfg","outside stride wxh: [%d %d]\n","mpp_sys_dec_buf_chk_proc",
               (ulong)cfg->h_stride_by_byte,(ulong)cfg->v_stride);
  }
  if ((uVar11 & 0xf00000) != 0) {
    if ((int)MVar1 < 0x1000005) {
      if (MVar1 == MPP_VIDEO_CodingAVC) goto LAB_0012ae75;
      if (MVar1 != MPP_VIDEO_CodingVP9) {
        if (MVar1 == MPP_VIDEO_CodingHEVC) goto LAB_0012adb6;
        goto LAB_0012ae60;
      }
      if (RVar12 == 0) {
        RVar12 = cfg->height;
      }
      uVar15 = cfg->width + 0x3f & 0xffffffc0;
      uVar11 = RVar12 + 0x3f & 0xffffffc0;
    }
    else {
      if (MVar1 + ~MPP_VIDEO_CodingHEVC < 3) {
LAB_0012ae75:
        RVar14 = cfg->width;
LAB_0012ae7c:
        if (RVar12 == 0) {
          RVar12 = cfg->height;
        }
        uVar15 = RVar14 + 0x3f & 0xffffffc0;
      }
      else {
        if (MVar1 == MPP_VIDEO_CodingAV1) {
LAB_0012adb6:
          RVar14 = cfg->width;
          goto LAB_0012ae7c;
        }
LAB_0012ae60:
        if (RVar12 == 0) {
          RVar12 = cfg->height;
        }
        uVar15 = cfg->width + 0xf & 0xfffffff0;
      }
      uVar11 = RVar12 + 0xf & 0xfffffff0;
    }
    if (((byte)mpp_sys_cfg_debug & 0x10) != 0) {
      _mpp_log_l(4,"mpp_sys_cfg","spec aligned pixel wxh: [%d %d]\n","mpp_sys_dec_buf_chk_proc",
                 (ulong)uVar15,(ulong)uVar11);
    }
    if (*compat_ext_fbc_hdr_256_odd == 0) {
      uVar9 = uVar15 + 0x3f & 0xffffffc0;
    }
    else {
      uVar9 = uVar15 + 0xff & 0xfffffe00 | 0x100;
    }
    if (((byte)mpp_sys_cfg_debug & 0x10) != 0) {
      _mpp_log_l(4,"mpp_sys_cfg","need 256 odd align: %d\n","mpp_sys_dec_buf_chk_proc");
    }
    uVar10 = 0x3fffffc0;
    iVar7 = 0x3f;
    if ((int)MVar1 < 0x1000004) {
      if ((MVar1 != MPP_VIDEO_CodingAVC) && (MVar1 != MPP_VIDEO_CodingVP9)) goto LAB_0012af61;
    }
    else if (3 < MVar1 + ~MPP_VIDEO_CodingVP6) {
LAB_0012af61:
      uVar10 = 0x3ffffff0;
      iVar7 = 0xf;
    }
    uVar10 = (uVar9 * iVar8 >> 3) + iVar7 & uVar10;
    if (((byte)mpp_sys_cfg_debug & 0x10) != 0) {
      _mpp_log_l(4,"mpp_sys_cfg","dec hw aligned hor_byte: [%d]\n","mpp_sys_dec_buf_chk_proc",
                 (ulong)uVar10);
    }
    cfg->h_stride_by_byte = uVar10;
    cfg->h_stride_by_pixel = uVar15;
    cfg->v_stride = uVar11;
    switch(MVar4) {
    case MPP_FMT_YUV420SP:
      iVar8 = ((int)(uVar15 * uVar11) >> 8) * 3;
      break;
    case MPP_FMT_YUV420SP_10BIT:
    case MPP_FMT_YUV422SP:
      uVar9 = (((int)(uVar15 * uVar11) >> 4) + 0x3fU & 0xffffffc0) + uVar15 * uVar11 * 2;
      goto LAB_0012b0a8;
    case MPP_FMT_YUV422SP_10BIT:
      iVar8 = ((int)(uVar15 * uVar11) >> 8) * 5;
      break;
    default:
      if (MVar4 != MPP_FMT_YUV444SP) {
        uVar9 = uVar11 * uVar10 * 3 >> 1;
        _mpp_log_l(2,"mpp_sys_cfg","dec out fmt 0x%x is no support",(char *)0x0,(ulong)MVar4);
        goto LAB_0012b0a8;
      }
      iVar8 = (uVar15 * uVar11 >> 8) * 0x300;
      goto LAB_0012b0a5;
    }
    iVar8 = iVar8 << 7;
LAB_0012b0a5:
    uVar9 = iVar8 + (((int)(uVar15 * uVar11) >> 4) + 0x3fU & 0xffffffc0);
LAB_0012b0a8:
    if ((((((byte)mpp_sys_cfg_debug & 0x10) != 0) &&
         (_mpp_log_l(4,"mpp_sys_cfg","res aligned_pixel %d\n","mpp_sys_dec_buf_chk_proc",
                     (ulong)uVar15), ((byte)mpp_sys_cfg_debug & 0x10) != 0)) &&
        (_mpp_log_l(4,"mpp_sys_cfg","res aligned_byte %d\n","mpp_sys_dec_buf_chk_proc",(ulong)uVar10
                   ), ((byte)mpp_sys_cfg_debug & 0x10) != 0)) &&
       (_mpp_log_l(4,"mpp_sys_cfg","res aligned_height %d\n","mpp_sys_dec_buf_chk_proc",
                   (ulong)uVar11), ((byte)mpp_sys_cfg_debug & 0x10) != 0)) {
      _mpp_log_l(4,"mpp_sys_cfg","res GPU aligned size_total: [%d]\n","mpp_sys_dec_buf_chk_proc",
                 (ulong)uVar9);
    }
    cfg->size_total = uVar9;
    return MPP_OK;
  }
  RVar5 = mpp_get_soc_type();
  uVar11 = cfg->width;
  uVar13 = (ulong)uVar11;
  if ((int)MVar1 < 0x1000004) {
    switch(MVar1) {
    default:
switchD_0012ae2d_caseD_5:
      RVar12 = cfg->height;
LAB_0012b1ce:
      uVar11 = RVar12 + 7 & 0xfffffff8;
      break;
    case MPP_VIDEO_CodingAVC:
      uVar13 = (ulong)(uVar11 + 0xf & 0xfffffff0);
    case MPP_VIDEO_CodingMPEG2:
    case MPP_VIDEO_CodingH263:
    case MPP_VIDEO_CodingMPEG4:
    case MPP_VIDEO_CodingVP8:
      uVar11 = cfg->height + 0xf & 0xfffffff0;
      break;
    case MPP_VIDEO_CodingVP9:
      RVar12 = cfg->height;
      if (RVar5 == ROCKCHIP_SOC_RK3588) {
        uVar11 = RVar12 + 0xf & 0xfffffff0;
      }
      else if (RVar5 == ROCKCHIP_SOC_RK3399) {
        uVar11 = RVar12 + 0x3f & 0xffffffc0;
      }
      else {
        uVar11 = RVar12 + 7 & 0xfffffff8;
      }
    }
  }
  else {
    if (MVar1 != MPP_VIDEO_CodingAV1) {
      if (MVar1 != MPP_VIDEO_CodingAVS2) {
        if (MVar1 == MPP_VIDEO_CodingHEVC) {
          uVar13 = (ulong)(uVar11 + 0x3f & 0xffffffc0);
        }
        goto switchD_0012ae2d_caseD_5;
      }
      uVar13 = (ulong)(uVar11 + 0x3f & 0xffffffc0);
      RVar12 = cfg->height;
      goto LAB_0012b1ce;
    }
    uVar11 = cfg->height + 7 & 0xfffffff8;
  }
  if (((byte)mpp_sys_cfg_debug & 0x10) != 0) {
    _mpp_log_l(4,"mpp_sys_cfg","spec aligned pixel wxh: [%d %d]\n","mpp_sys_dec_buf_chk_proc",uVar13
               ,(ulong)uVar11);
  }
  RVar12 = (uint)(iVar8 * (int)uVar13) >> 3;
  if (cfg->h_stride_by_byte != 0) {
    RVar12 = cfg->h_stride_by_byte;
  }
  if (MVar1 == MPP_VIDEO_CodingVP9) {
    if (RVar5 == ROCKCHIP_SOC_RK3576) {
      uVar15 = RVar12 + 0x3f & 0xffffffc0;
      if ((RVar12 - 1 & 0xc0) != 0x80) {
        uVar15 = uVar15 + 0x7f & 0xffffff00 | 0xc0;
      }
    }
    else {
      uVar15 = RVar12 + 0xff & 0xfffffe00 | 0x100;
    }
  }
  else if (MVar1 == MPP_VIDEO_CodingAV1) {
    if (RVar5 == ROCKCHIP_SOC_RK3588) goto LAB_0012b24e;
    uVar15 = RVar12 + 0x7f & 0xffffff80;
  }
  else if (MVar1 == MPP_VIDEO_CodingHEVC) {
    uVar15 = RVar12 + 0x3f & 0xffffffc0;
  }
  else {
LAB_0012b24e:
    uVar15 = RVar12 + 0xf & 0xfffffff0;
  }
  if (((byte)mpp_sys_cfg_debug & 0x10) != 0) {
    _mpp_log_l(4,"mpp_sys_cfg","dec hw aligned hor_byte: [%d %d]\n","mpp_sys_dec_buf_chk_proc",
               (ulong)uVar15);
  }
  if (MVar1 != MPP_VIDEO_CodingMJPEG &&
      ((RVar5 == ROCKCHIP_SOC_RK3399 || RVar5 == ROCKCHIP_SOC_RK3576) || 0x780 < uVar15)) {
    if (RVar5 - ROCKCHIP_SOC_RK3568 < 4) {
LAB_0012b31c:
      uVar9 = uVar15 + 0xff & 0xfffffe00 | 0x100;
    }
    else {
      if (RVar5 != ROCKCHIP_SOC_RK3576) {
        if (RVar5 != ROCKCHIP_SOC_RK3399) goto LAB_0012b3ca;
        goto LAB_0012b31c;
      }
      uVar9 = uVar15 + 0x3f & 0xffffffc0;
      if ((uVar15 - 1 & 0xc0) != 0x80) {
        uVar9 = uVar9 + 0x7f & 0xffffff00 | 0xc0;
      }
    }
    uVar15 = uVar9;
    if (MVar4 < MPP_FMT_AYUV2BPP) {
      if ((0x2000aU >> (MVar2 & (MPP_FMT_YUV444P|MPP_FMT_YUV444SP)) & 1) == 0) {
        if ((0x300U >> (MVar2 & (MPP_FMT_YUV444P|MPP_FMT_YUV444SP)) & 1) == 0) goto LAB_0012b397;
        goto LAB_0012b3c4;
      }
      uVar13 = (ulong)(uVar9 * 8) / 10;
    }
    else {
LAB_0012b397:
      if (MVar4 - MPP_FMT_RGB565 < 2) {
LAB_0012b3c4:
        uVar13 = (ulong)(uVar9 >> 1);
      }
      else if (MVar4 - MPP_FMT_RGB888 < 2) {
        uVar13 = (ulong)uVar9 / 3;
      }
      else {
        uVar13 = (ulong)uVar9;
      }
    }
  }
LAB_0012b3ca:
  if (((byte)mpp_sys_cfg_debug & 0x10) == 0) {
    cfg->h_stride_by_byte = uVar15;
    cfg->h_stride_by_pixel = (RK_U32)uVar13;
    cfg->v_stride = uVar11;
  }
  else {
    _mpp_log_l(4,"mpp_sys_cfg","dec hw performance aligned hor_byte: [%d]\n",
               "mpp_sys_dec_buf_chk_proc");
    bVar3 = (byte)mpp_sys_cfg_debug & 0x10;
    cfg->h_stride_by_byte = uVar15;
    cfg->h_stride_by_pixel = (RK_U32)uVar13;
    cfg->v_stride = uVar11;
    if (((bVar3 != 0) &&
        (_mpp_log_l(4,"mpp_sys_cfg","fmt_raw %x\n","mpp_sys_dec_buf_chk_proc",(ulong)MVar2),
        ((byte)mpp_sys_cfg_debug & 0x10) != 0)) &&
       ((_mpp_log_l(4,"mpp_sys_cfg","res aligned_pixel %d\n","mpp_sys_dec_buf_chk_proc",uVar13),
        ((byte)mpp_sys_cfg_debug & 0x10) != 0 &&
        (_mpp_log_l(4,"mpp_sys_cfg","res aligned_byte %d\n","mpp_sys_dec_buf_chk_proc",(ulong)uVar15
                   ), ((byte)mpp_sys_cfg_debug & 0x10) != 0)))) {
      _mpp_log_l(4,"mpp_sys_cfg","res aligned_height %d\n","mpp_sys_dec_buf_chk_proc",uVar11);
    }
  }
  uVar15 = uVar15 * uVar11;
  uVar11 = uVar15;
  switch(MVar2) {
  case MPP_FMT_YUV420SP:
  case MPP_FMT_YUV420SP_10BIT:
  case MPP_FMT_YUV420P:
  case MPP_FMT_YUV420SP_VU:
    SVar6 = MVar1 == MPP_VIDEO_CodingAVC | SYS_CFG_ALIGN_LEN_DEFAULT;
    bVar16 = MVar1 == MPP_VIDEO_CodingAV1;
    type = SYS_CFG_ALIGN_LEN_420_AV1;
    goto LAB_0012b530;
  case MPP_FMT_YUV422SP:
  case MPP_FMT_YUV422SP_10BIT:
  case MPP_FMT_YUV422P:
  case MPP_FMT_YUV422SP_VU:
  case MPP_FMT_YUV422_YUYV:
  case MPP_FMT_YUV422_YVYU:
  case MPP_FMT_YUV422_UYVY:
  case MPP_FMT_YUV422_VYUY:
  case MPP_FMT_YUV440SP:
  case MPP_FMT_YUV411SP:
    SVar6 = (uint)(MVar1 == MPP_VIDEO_CodingAV1) * 4 + SYS_CFG_ALIGN_LEN_422;
    bVar16 = MVar1 == MPP_VIDEO_CodingAVC;
    type = SYS_CFG_ALIGN_LEN_422_AVC;
LAB_0012b530:
    if (!bVar16) {
      type = SVar6;
    }
    uVar11 = mpp_sys_cfg_align(type,uVar15);
    break;
  case MPP_FMT_YUV400:
    break;
  case MPP_FMT_YUV444SP:
  case MPP_FMT_YUV444P:
  case MPP_FMT_YUV444SP_10BIT:
    uVar11 = uVar15 * 3;
    break;
  default:
    uVar11 = uVar15 * 3 >> 1;
  }
  if (((byte)mpp_sys_cfg_debug & 0x10) != 0) {
    _mpp_log_l(4,"mpp_sys_cfg","res size total %d -> %d\n","mpp_sys_dec_buf_chk_proc",(ulong)uVar15,
               (ulong)uVar11);
  }
  cfg->size_total = uVar11;
  return MPP_OK;
}

Assistant:

MPP_RET mpp_sys_dec_buf_chk_proc(MppSysDecBufChkCfg *cfg)
{
    MppCodingType type = cfg->type;
    MppFrameFormat fmt = (MppFrameFormat)(((RK_U32)cfg->fmt_codec & MPP_FRAME_FMT_MASK) |
                                          (cfg->fmt_fbc & MPP_FRAME_FBC_MASK) |
                                          (cfg->fmt_hdr & MPP_FRAME_HDR_MASK));
    MppFrameFormat fmt_raw = cfg->fmt_codec;

    RK_U32 aligned_pixel = 0;
    RK_U32 aligned_pixel_byte = 0;
    RK_U32 aligned_byte = 0;
    RK_U32 aligned_height = 0;
    RK_U32 size_total = 0;
    RK_U32 size_total_old = 0;
    RK_U32 depth = MPP_FRAME_FMT_IS_YUV_10BIT(fmt) ? 10 : 8;

    if (type == MPP_VIDEO_CodingUnused) {
        mpp_err("The coding type is invalid");
        return MPP_NOK;
    }

    /* use codec stride */
    if (cfg->h_stride_by_byte)
        aligned_pixel = cfg->h_stride_by_byte * 8 / depth;
    if (cfg->v_stride)
        aligned_height = cfg->v_stride;

    sys_cfg_dbg_dec_buf("org pixel wxh: [%d %d]\n", cfg->width, cfg->height);
    sys_cfg_dbg_dec_buf("outside stride wxh: [%d %d]\n",
                        cfg->h_stride_by_byte, cfg->v_stride);
    if (MPP_FRAME_FMT_IS_FBC(fmt)) {
        /* fbc case */
        switch (type) {
        case MPP_VIDEO_CodingHEVC :
        case MPP_VIDEO_CodingAV1 : {
            aligned_pixel = MPP_ALIGN(cfg->width, 64);
            aligned_height = MPP_ALIGN(aligned_height ? aligned_height : cfg->height, 16);
        } break;
        case MPP_VIDEO_CodingAVC :
        case MPP_VIDEO_CodingAVSPLUS :
        case MPP_VIDEO_CodingAVS :
        case MPP_VIDEO_CodingAVS2 : {
            aligned_pixel = MPP_ALIGN(cfg->width, 64);
            aligned_height = MPP_ALIGN(aligned_height ? aligned_height : cfg->height, 16);
        } break;
        case MPP_VIDEO_CodingVP9 : {
            aligned_pixel = MPP_ALIGN(cfg->width, 64);
            aligned_height = MPP_ALIGN(aligned_height ? aligned_height : cfg->height, 64);
        } break;
        default : {
            aligned_pixel = MPP_ALIGN(cfg->width, 16);
            aligned_height = MPP_ALIGN(aligned_height ? aligned_height : cfg->height, 16);
        } break;
        }
        sys_cfg_dbg_dec_buf("spec aligned pixel wxh: [%d %d]\n", aligned_pixel, aligned_height);

        /*fbc stride default 64 align*/
        if (*compat_ext_fbc_hdr_256_odd)
            aligned_pixel_byte = (MPP_ALIGN(aligned_pixel, 256) | 256) * depth >> 3;
        else
            aligned_pixel_byte = MPP_ALIGN(aligned_pixel, 64) * depth >> 3;
        sys_cfg_dbg_dec_buf("need 256 odd align: %d\n", *compat_ext_fbc_hdr_256_odd);

        switch (type) {
        case MPP_VIDEO_CodingAVC :
        case MPP_VIDEO_CodingAVSPLUS :
        case MPP_VIDEO_CodingAVS :
        case MPP_VIDEO_CodingAVS2 : {
            aligned_byte = MPP_ALIGN(aligned_pixel_byte, 64);
        } break;
        case MPP_VIDEO_CodingHEVC : {
            aligned_byte = MPP_ALIGN(aligned_pixel_byte, 64);
        } break;
        case MPP_VIDEO_CodingVP9 : {
            aligned_byte = MPP_ALIGN(aligned_pixel_byte, 64);
        } break;
        case MPP_VIDEO_CodingAV1 : {
            aligned_byte = MPP_ALIGN(aligned_pixel_byte, 16);
        } break;
        default : {
            aligned_byte = MPP_ALIGN(aligned_pixel_byte, 16);
        } break;
        }
        sys_cfg_dbg_dec_buf("dec hw aligned hor_byte: [%d]\n", aligned_byte);

        cfg->h_stride_by_byte = aligned_byte;
        cfg->h_stride_by_pixel = aligned_pixel;
        cfg->v_stride = aligned_height;

        switch ((fmt_raw & MPP_FRAME_FMT_MASK)) {
        case MPP_FMT_YUV420SP_10BIT : {
            size_total = get_afbc_min_size(aligned_pixel, aligned_height, 15);
        } break;
        case MPP_FMT_YUV422SP_10BIT : {
            size_total = get_afbc_min_size(aligned_pixel, aligned_height, 20);
        } break;
        case MPP_FMT_YUV420SP : {
            size_total = get_afbc_min_size(aligned_pixel, aligned_height, 12);
        } break;
        case MPP_FMT_YUV422SP : {
            size_total = get_afbc_min_size(aligned_pixel, aligned_height, 16);
        } break;
        case MPP_FMT_YUV444SP : {
            size_total = get_afbc_min_size(aligned_pixel, aligned_height, 24);
        } break;
        default : {
            size_total = aligned_byte * aligned_height * 3 / 2;
            mpp_err("dec out fmt 0x%x is no support", fmt_raw & MPP_FRAME_FMT_MASK);
        } break;
        }
        sys_cfg_dbg_dec_buf("res aligned_pixel %d\n", aligned_pixel);
        sys_cfg_dbg_dec_buf("res aligned_byte %d\n", aligned_byte);
        sys_cfg_dbg_dec_buf("res aligned_height %d\n", aligned_height);
        sys_cfg_dbg_dec_buf("res GPU aligned size_total: [%d]\n", size_total);

        cfg->size_total = size_total;
    } else {
        /* tile case */
        /* raster case */
        RockchipSocType soc_type = mpp_get_soc_type();

        aligned_pixel = cfg->width;
        switch (type) {
        case MPP_VIDEO_CodingHEVC : {
            aligned_pixel = MPP_ALIGN(cfg->width, 64);
            aligned_height = MPP_ALIGN(cfg->height, 8);
        } break;
        /*
         * avc aligned to ctu
         * p_Vid->width = p_Vid->PicWidthInMbs * 16
         * p_Vid->height = p_Vid->FrameHeightInMbs * 16
         */
        case MPP_VIDEO_CodingAVC : {
            aligned_pixel = MPP_ALIGN(cfg->width, 16);
            aligned_height = MPP_ALIGN(cfg->height, 16);
        } break;
        case MPP_VIDEO_CodingVP9 : {
            if (soc_type == ROCKCHIP_SOC_RK3399)
                aligned_height = MPP_ALIGN(cfg->height, 64);
            else if (soc_type == ROCKCHIP_SOC_RK3588)
                aligned_height = MPP_ALIGN(cfg->height, 16);
            else
                aligned_height = MPP_ALIGN(cfg->height, 8);
        } break;
        case MPP_VIDEO_CodingAV1 : {
            aligned_height = MPP_ALIGN(cfg->height, 8);
        } break;
        case MPP_VIDEO_CodingVP8 :
        case MPP_VIDEO_CodingH263 :
        case MPP_VIDEO_CodingMPEG2 :
        case MPP_VIDEO_CodingMPEG4 : {
            aligned_height = MPP_ALIGN(cfg->height, 16);
        } break;
        case MPP_VIDEO_CodingAVS2 : {
            aligned_pixel = MPP_ALIGN(cfg->width, 64);
            aligned_height = MPP_ALIGN(cfg->height, 8);
        } break;
        default : {
            aligned_height = MPP_ALIGN(cfg->height, 8);
        } break;
        }
        sys_cfg_dbg_dec_buf("spec aligned pixel wxh: [%d %d]\n", aligned_pixel, aligned_height);

        aligned_pixel_byte = cfg->h_stride_by_byte ? cfg->h_stride_by_byte :
                             aligned_pixel * depth / 8;

        switch (type) {
        case MPP_VIDEO_CodingHEVC : {
            aligned_byte = mpp_sys_cfg_align(SYS_CFG_ALIGN_64, aligned_pixel_byte);
        } break;
        case MPP_VIDEO_CodingVP9 : {
            if (soc_type == ROCKCHIP_SOC_RK3576)
                aligned_byte = mpp_sys_cfg_align(SYS_CFG_ALIGN_128_ODD_PLUS_64,
                                                 aligned_pixel_byte);
            else
                aligned_byte = mpp_sys_cfg_align(SYS_CFG_ALIGN_256_ODD, aligned_pixel_byte);
        } break;
        case MPP_VIDEO_CodingAV1 : {
            if (soc_type == ROCKCHIP_SOC_RK3588)
                aligned_byte = mpp_sys_cfg_align(SYS_CFG_ALIGN_16, aligned_pixel_byte);
            else
                aligned_byte = mpp_sys_cfg_align(SYS_CFG_ALIGN_128, aligned_pixel_byte);
        } break;
        default : {
            aligned_byte = mpp_sys_cfg_align(SYS_CFG_ALIGN_16, aligned_pixel_byte);
        } break;
        }
        sys_cfg_dbg_dec_buf("dec hw aligned hor_byte: [%d %d]\n", aligned_byte);

        /*
         * NOTE: rk3576 use 128 odd plus 64 for all non jpeg format
         * all the other socs use 256 odd on larger than 1080p
         */
        if ((aligned_byte > 1920 || soc_type == ROCKCHIP_SOC_RK3576 || soc_type == ROCKCHIP_SOC_RK3399)
            && type != MPP_VIDEO_CodingMJPEG) {
            rk_s32 update = 0;

            switch (soc_type) {
            case ROCKCHIP_SOC_RK3399 :
            case ROCKCHIP_SOC_RK3568 :
            case ROCKCHIP_SOC_RK3562 :
            case ROCKCHIP_SOC_RK3528 :
            case ROCKCHIP_SOC_RK3588 : {
                aligned_byte = mpp_sys_cfg_align(SYS_CFG_ALIGN_256_ODD, aligned_byte);
                update = 1;
            } break;
            case ROCKCHIP_SOC_RK3576 : {
                aligned_byte = mpp_sys_cfg_align(SYS_CFG_ALIGN_128_ODD_PLUS_64, aligned_byte);
                update = 1;
            } break;
            default : {
            } break;
            }

            /*
             * recalc aligned_pixel here
             * NOTE: no RGB format here in fact
             */
            if (update) {
                switch (fmt & MPP_FRAME_FMT_MASK) {
                case MPP_FMT_YUV420SP_10BIT:
                case MPP_FMT_YUV422SP_10BIT:
                case MPP_FMT_YUV444SP_10BIT: {
                    aligned_pixel = aligned_byte * 8 / 10;
                } break;
                case MPP_FMT_YUV422_YVYU:
                case MPP_FMT_YUV422_YUYV:
                case MPP_FMT_RGB565:
                case MPP_FMT_BGR565: {
                    aligned_pixel = aligned_byte / 2;
                } break;
                case MPP_FMT_RGB888:
                case MPP_FMT_BGR888: {
                    aligned_pixel = aligned_byte / 3;
                } break;
                default : {
                    aligned_pixel = aligned_byte;
                } break;
                }
            }
        }
        sys_cfg_dbg_dec_buf("dec hw performance aligned hor_byte: [%d]\n", aligned_pixel);

        cfg->h_stride_by_byte = aligned_byte;
        cfg->h_stride_by_pixel = aligned_pixel;
        cfg->v_stride = aligned_height;

        size_total = aligned_byte * aligned_height;
        size_total_old = size_total;
        sys_cfg_dbg_dec_buf("fmt_raw %x\n", fmt_raw);
        sys_cfg_dbg_dec_buf("res aligned_pixel %d\n", aligned_pixel);
        sys_cfg_dbg_dec_buf("res aligned_byte %d\n", aligned_byte);
        sys_cfg_dbg_dec_buf("res aligned_height %d\n", aligned_height);

        switch (fmt_raw) {
        case MPP_FMT_YUV420SP :
        case MPP_FMT_YUV420SP_10BIT :
        case MPP_FMT_YUV420P :
        case MPP_FMT_YUV420SP_VU : {
            SysCfgAlignType align_type = SYS_CFG_ALIGN_LEN_DEFAULT;

            /* hevc and vp9 - SYS_CFG_ALIGN_LEN_DEFAULT */
            if (type == MPP_VIDEO_CodingAV1)
                align_type = SYS_CFG_ALIGN_LEN_420_AV1;
            else if (type == MPP_VIDEO_CodingAVC)
                align_type = SYS_CFG_ALIGN_LEN_420;

            size_total = mpp_sys_cfg_align(align_type, size_total);
        } break;
        case MPP_FMT_YUV422SP :
        case MPP_FMT_YUV422SP_10BIT :
        case MPP_FMT_YUV422P :
        case MPP_FMT_YUV422SP_VU :
        case MPP_FMT_YUV422_YUYV :
        case MPP_FMT_YUV422_YVYU :
        case MPP_FMT_YUV422_UYVY :
        case MPP_FMT_YUV422_VYUY :
        case MPP_FMT_YUV440SP :
        case MPP_FMT_YUV411SP : {
            SysCfgAlignType align_type;

            if (type == MPP_VIDEO_CodingAVC)
                align_type = SYS_CFG_ALIGN_LEN_422_AVC;
            else if (type == MPP_VIDEO_CodingAV1)
                align_type = SYS_CFG_ALIGN_LEN_422_AV1;
            else
                align_type = SYS_CFG_ALIGN_LEN_422;

            size_total = mpp_sys_cfg_align(align_type, size_total);
        } break;
        case MPP_FMT_YUV400 : {
            /* do nothing */
        } break;
        case MPP_FMT_YUV444SP :
        case MPP_FMT_YUV444P :
        case MPP_FMT_YUV444SP_10BIT : {
            size_total = mpp_sys_cfg_align(SYS_CFG_ALIGN_LEN_444, size_total);
        } break;
        default : {
            size_total = size_total * 3 / 2;
        }
        }
        sys_cfg_dbg_dec_buf("res size total %d -> %d\n", size_total_old, size_total);

        cfg->size_total = size_total;
    }

    return MPP_OK;
}